

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::SetItem
          (CustomExternalWrapperObject *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  anon_class_32_4_e5c51701 fn_00;
  Var newValue;
  BOOL BVar1;
  ScriptContext *pSVar2;
  BOOL trapResult;
  anon_class_32_4_e5c51701 fn;
  anon_class_8_1_a81517f2 getPropertyName;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  CustomExternalWrapperObject *pCStack_18;
  uint32 index_local;
  CustomExternalWrapperObject *this_local;
  
  getPropertyName.index._4_4_ = flags;
  pvStack_28 = value;
  value_local._4_4_ = index;
  pCStack_18 = this;
  BVar1 = VerifyObjectAlive(this);
  newValue = pvStack_28;
  if (BVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    fn_00.this = this;
    fn_00.value = &stack0xffffffffffffffd8;
    fn_00.index = (uint32 *)((long)&value_local + 4);
    fn_00.flags = (PropertyOperationFlags *)((long)&getPropertyName.index + 4);
    BVar1 = SetPropertyTrap<Js::CustomExternalWrapperObject::SetItem(unsigned_int,void*,Js::PropertyOperationFlags)::__0,Js::CustomExternalWrapperObject::SetItem(unsigned_int,void*,Js::PropertyOperationFlags)::__1>
                      (this,this,SetItemKind,(uint32 *)((long)&value_local + 4),newValue,pSVar2,
                       getPropertyName.index._4_4_,0,fn_00,(PropertyValueInfo *)0x0);
    if (BVar1 == 0) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pvStack_28 = CrossSite::MarshalVar(pSVar2,pvStack_28,false);
      this_local._4_4_ =
           DynamicObject::SetItem
                     (&this->super_DynamicObject,value_local._4_4_,pvStack_28,
                      getPropertyName.index._4_4_);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::SetItem(uint32 index, Js::Var value, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetItem(index, value, flags);
    };
    BOOL trapResult = SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetItemKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, nullptr);
    if (!trapResult)
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return Js::DynamicObject::SetItem(index, value, flags);
    }

    return TRUE;
}